

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall re2::Regexp::ParseState::DoRightParen(ParseState *this)

{
  Regexp *this_00;
  RegexpStatus *pRVar1;
  size_type sVar2;
  bool bVar3;
  Regexp *pRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ParseState *this_01;
  
  this_01 = this;
  DoAlternation(this);
  pRVar4 = this->stacktop_;
  if (((pRVar4 == (Regexp *)0x0) || (this_00 = pRVar4->down_, this_00 == (Regexp *)0x0)) ||
     (this_00->op_ != '\x16')) {
    pRVar1 = this->status_;
    pRVar1->code_ = kRegexpUnexpectedParen;
    sVar2 = (this->whole_regexp_).size_;
    (pRVar1->error_arg_).data_ = (this->whole_regexp_).data_;
    (pRVar1->error_arg_).size_ = sVar2;
    bVar3 = false;
  }
  else {
    this->stacktop_ = this_00->down_;
    this->flags_ = (uint)this_00->parse_flags_;
    if ((this_00->field_7).field_0.max_ < 1) {
      Decref(this_00);
    }
    else {
      this_00->op_ = '\v';
      this_00->nsub_ = 1;
      pRVar4 = FinishRegexp(this_01,pRVar4);
      if (this_00->nsub_ < 2) {
        paVar5 = &this_00->field_5;
      }
      else {
        paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this_00->field_5).submany_;
      }
      paVar5->subone_ = pRVar4;
      bVar3 = ComputeSimple(this_00);
      this_00->simple_ = bVar3;
      pRVar4 = this_00;
    }
    PushRegexp(this,pRVar4);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Regexp::ParseState::DoRightParen() {
  // Finish the current concatenation and alternation.
  DoAlternation();

  // The stack should be: LeftParen regexp
  // Remove the LeftParen, leaving the regexp,
  // parenthesized.
  Regexp* r1;
  Regexp* r2;
  if ((r1 = stacktop_) == NULL ||
      (r2 = r1->down_) == NULL ||
      r2->op() != kLeftParen) {
    status_->set_code(kRegexpUnexpectedParen);
    status_->set_error_arg(whole_regexp_);
    return false;
  }

  // Pop off r1, r2.  Will Decref or reuse below.
  stacktop_ = r2->down_;

  // Restore flags from when paren opened.
  Regexp* re = r2;
  flags_ = re->parse_flags();

  // Rewrite LeftParen as capture if needed.
  if (re->cap_ > 0) {
    re->op_ = kRegexpCapture;
    // re->cap_ is already set
    re->AllocSub(1);
    re->sub()[0] = FinishRegexp(r1);
    re->simple_ = re->ComputeSimple();
  } else {
    re->Decref();
    re = r1;
  }
  return PushRegexp(re);
}